

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O3

void __thiscall Conn::del_conn(Conn *this,int fd)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  const_iterator __position;
  
  fprintf(_stderr,"%s(%d)-<%s>: cur conn fd size %lu\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp",
          0xcf,"del_conn",(this->_conn_info_map)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  fflush(_stderr);
  p_Var2 = (this->_conn_info_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->_conn_info_map)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var1->_M_header;
    do {
      if (fd <= (int)p_Var2[1]._M_color) {
        __position._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < fd];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
       ((int)__position._M_node[1]._M_color <= fd)) {
      std::
      _Rb_tree<int,_std::pair<const_int,_ConnInfo>,_std::_Select1st<std::pair<const_int,_ConnInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ConnInfo>_>_>
      ::_M_erase_aux(&(this->_conn_info_map)._M_t,__position);
    }
  }
  Epoll::del_event(&this->_epoll,fd,5);
  close(fd);
  return;
}

Assistant:

void Conn::del_conn(const int fd)
{
    LOG_PRINT("cur conn fd size %lu", _conn_info_map.size());
    if (_conn_info_map.size() < 0)
    {
        LOG_PRINT("have no fds");
        return ;
    }

    std::map<int, ConnInfo>::iterator it = _conn_info_map.find(fd);
    if (it != _conn_info_map.end())
    {
        _conn_info_map.erase(it);
    }

    _epoll.del_event(fd, EPOLLIN|EPOLLOUT);
    close(fd);
}